

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::Clipper::ExecuteInternal(Clipper *this,bool fixHoleLinkages)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  OutRec *pOVar4;
  reference ppOVar5;
  long64 topY_00;
  iterator __first;
  iterator __last;
  double dVar6;
  OutRec *outRec;
  size_type i;
  long64 topY;
  long64 botY;
  bool succeeded;
  bool fixHoleLinkages_local;
  Clipper *this_local;
  
  (*this->_vptr_Clipper[3])();
  if (*(long *)(this->_vptr_Clipper[-3] +
               (long)&(this->m_PolyOuts).
                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
               ) == 0) {
    this_local._7_1_ = true;
  }
  else {
    topY = PopScanbeam(this);
    do {
      InsertLocalMinimaIntoAEL(this,topY);
      ClearHorzJoins(this);
      ProcessHorizontals(this);
      topY_00 = PopScanbeam(this);
      this_local._7_1_ = ProcessIntersections(this,topY,topY_00);
      if (!this_local._7_1_) break;
      ProcessEdgesAtTopOfScanbeam(this,topY_00);
      topY = topY_00;
    } while (this->m_Scanbeam != (Scanbeam *)0x0);
    if (this_local._7_1_) {
      for (outRec = (OutRec *)0x0;
          pOVar4 = (OutRec *)
                   std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                             (&this->m_PolyOuts), outRec < pOVar4;
          outRec = (OutRec *)((long)&outRec->idx + 1)) {
        ppOVar5 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                  operator[](&this->m_PolyOuts,(size_type)outRec);
        pOVar4 = *ppOVar5;
        if ((pOVar4->pts != (OutPt *)0x0) &&
           (FixupOutPolygon(this,pOVar4), pOVar4->pts != (OutPt *)0x0)) {
          if (((pOVar4->isHole & 1U) != 0) && (fixHoleLinkages)) {
            FixHoleLinkage(this,pOVar4);
          }
          if (pOVar4->bottomPt == pOVar4->bottomFlag) {
            bVar2 = Orientation(pOVar4,(bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                    [(long)&(this->m_PolyOuts).
                                                                                                                        
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ] & 1));
            dVar6 = Area(pOVar4,(bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                             [(long)&(this->m_PolyOuts).
                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                             ] & 1));
            if (bVar2 != 0.0 < dVar6) {
              DisposeBottomPt(this,pOVar4);
            }
          }
          bVar2 = pOVar4->isHole;
          bVar1 = this->m_ReverseOutput;
          bVar3 = Orientation(pOVar4,(bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                  [(long)&(this->m_PolyOuts).
                                                                                                                    
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ] & 1));
          if ((bVar2 & 1U) == (bVar1 & 1U ^ bVar3)) {
            ReversePolyPtLinks(pOVar4->pts);
          }
        }
      }
      JoinCommonEdges(this,fixHoleLinkages);
      if (fixHoleLinkages) {
        __first = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::begin
                            (&this->m_PolyOuts);
        __last = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::end
                           (&this->m_PolyOuts);
        std::
        sort<__gnu_cxx::__normal_iterator<ClipperLib::OutRec**,std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>>,bool(*)(ClipperLib::OutRec*,ClipperLib::OutRec*)>
                  ((__normal_iterator<ClipperLib::OutRec_**,_std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>_>
                    )__first._M_current,
                   (__normal_iterator<ClipperLib::OutRec_**,_std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>_>
                    )__last._M_current,PolySort);
      }
    }
    ClearJoins(this);
    ClearHorzJoins(this);
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::ExecuteInternal(bool fixHoleLinkages)
{
  bool succeeded;
  try {
    Reset();
    if (!m_CurrentLM ) return true;
    long64 botY = PopScanbeam();
    do {
      InsertLocalMinimaIntoAEL(botY);
      ClearHorzJoins();
      ProcessHorizontals();
      long64 topY = PopScanbeam();
      succeeded = ProcessIntersections(botY, topY);
      if (!succeeded) break;
      ProcessEdgesAtTopOfScanbeam(topY);
      botY = topY;
    } while( m_Scanbeam );
  }
  catch(...) {
    succeeded = false;
  }

  if (succeeded)
  {
    //tidy up output polygons and fix orientations where necessary ...
    for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
    {
      OutRec *outRec = m_PolyOuts[i];
      if (!outRec->pts) continue;
      FixupOutPolygon(*outRec);
      if (!outRec->pts) continue;
      if (outRec->isHole && fixHoleLinkages) FixHoleLinkage(outRec);

      if (outRec->bottomPt == outRec->bottomFlag &&
        (Orientation(outRec, m_UseFullRange) != (Area(*outRec, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec);

      if (outRec->isHole ==
        (m_ReverseOutput ^ Orientation(outRec, m_UseFullRange)))
          ReversePolyPtLinks(*outRec->pts);
    }

    JoinCommonEdges(fixHoleLinkages);
    if (fixHoleLinkages)
      std::sort(m_PolyOuts.begin(), m_PolyOuts.end(), PolySort);
  }

  ClearJoins();
  ClearHorzJoins();
  return succeeded;
}